

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::LobsterGenerator
          (LobsterGenerator *this,Parser *parser,string *path,string *file_name)

{
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_89);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,".",&local_8a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"lobster",&local_8b);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_68,&local_88,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fabe8;
  (this->keywords_)._M_h._M_buckets = &(this->keywords_)._M_h._M_single_bucket;
  (this->keywords_)._M_h._M_bucket_count = 1;
  (this->keywords_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->keywords_)._M_h._M_element_count = 0;
  (this->keywords_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->keywords_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->keywords_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->current_namespace_)._M_dataplus._M_p = (pointer)&(this->current_namespace_).field_2;
  (this->current_namespace_)._M_string_length = 0;
  (this->current_namespace_).field_2._M_local_buf[0] = '\0';
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::insert<char_const*const*>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->keywords_,LobsterGenerator::keywords,&typeinfo);
  return;
}

Assistant:

LobsterGenerator(const Parser &parser, const std::string &path,
                   const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "" /* not used */, ".",
                      "lobster") {
    static const char *const keywords[] = {
      "nil",    "true",    "false",     "return",  "struct",    "class",
      "import", "int",     "float",     "string",  "any",       "def",
      "is",     "from",    "program",   "private", "coroutine", "resource",
      "enum",   "typeof",  "var",       "let",     "pakfile",   "switch",
      "case",   "default", "namespace", "not",     "and",       "or",
      "bool",
    };
    keywords_.insert(std::begin(keywords), std::end(keywords));
  }